

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8_fp16.h
# Opt level: O3

void ncnn::conv2x2s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  undefined1 (*pauVar20) [32];
  undefined4 *puVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [16];
  long lVar24;
  int iVar25;
  undefined4 *puVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  ulong local_208;
  undefined1 local_78 [32];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    uVar4 = top_blob->w;
    iVar5 = top_blob->h;
    uVar6 = bottom_blob->c;
    lVar24 = 0;
    do {
      iVar18 = 1;
      if (top_blob->dims != 3) {
        iVar18 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar27 = *(undefined1 (*) [32])(&_bias->data + lVar24 * 4);
      }
      pauVar22 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar24 * top_blob->elemsize + (long)top_blob->data);
      iVar18 = iVar18 * top_blob->h * top_blob->w;
      pauVar20 = pauVar22;
      if (0 < iVar18) {
        do {
          *pauVar20 = auVar27;
          iVar18 = iVar18 + -1;
          pauVar20 = pauVar20 + 1;
        } while (iVar18 != 0);
      }
      if (0 < (int)uVar6) {
        local_208 = 0;
        do {
          if (0 < iVar5) {
            pauVar23 = (undefined1 (*) [16])
                       ((long)kernel->data +
                       (long)kernel->w * local_208 * kernel->elemsize +
                       kernel->cstep * lVar24 * kernel->elemsize);
            puVar21 = (undefined4 *)
                      (bottom_blob->cstep * local_208 * bottom_blob->elemsize +
                      (long)bottom_blob->data);
            puVar26 = (undefined4 *)((long)bottom_blob->w * bottom_blob->elemsize + (long)puVar21);
            iVar18 = 0;
            pauVar20 = pauVar22;
            do {
              if ((int)uVar4 < 2) {
                uVar19 = 0;
              }
              else {
                iVar25 = 1;
                do {
                  uVar1 = *puVar21;
                  auVar28._4_4_ = uVar1;
                  auVar28._0_4_ = uVar1;
                  auVar28._8_4_ = uVar1;
                  auVar28._12_4_ = uVar1;
                  auVar28._16_4_ = uVar1;
                  auVar28._20_4_ = uVar1;
                  auVar28._24_4_ = uVar1;
                  auVar28._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar60._16_4_ = uVar1;
                  auVar60._20_4_ = uVar1;
                  auVar60._24_4_ = uVar1;
                  auVar60._28_4_ = uVar1;
                  uVar1 = puVar21[2];
                  auVar53._4_4_ = uVar1;
                  auVar53._0_4_ = uVar1;
                  auVar53._8_4_ = uVar1;
                  auVar53._12_4_ = uVar1;
                  auVar53._16_4_ = uVar1;
                  auVar53._20_4_ = uVar1;
                  auVar53._24_4_ = uVar1;
                  auVar53._28_4_ = uVar1;
                  uVar1 = puVar21[3];
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  uVar1 = puVar21[4];
                  auVar91._4_4_ = uVar1;
                  auVar91._0_4_ = uVar1;
                  auVar91._8_4_ = uVar1;
                  auVar91._12_4_ = uVar1;
                  auVar91._16_4_ = uVar1;
                  auVar91._20_4_ = uVar1;
                  auVar91._24_4_ = uVar1;
                  auVar91._28_4_ = uVar1;
                  uVar1 = puVar21[5];
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  auVar81._16_4_ = uVar1;
                  auVar81._20_4_ = uVar1;
                  auVar81._24_4_ = uVar1;
                  auVar81._28_4_ = uVar1;
                  uVar1 = puVar21[6];
                  local_78._4_4_ = puVar21[7];
                  local_78._0_4_ = local_78._4_4_;
                  local_78._8_4_ = local_78._4_4_;
                  local_78._12_4_ = local_78._4_4_;
                  local_78._16_4_ = local_78._4_4_;
                  local_78._20_4_ = local_78._4_4_;
                  local_78._24_4_ = local_78._4_4_;
                  local_78._28_4_ = local_78._4_4_;
                  auVar7 = vlddqu_avx(*pauVar23);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[1]);
                  auVar29 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[2]);
                  auVar32 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[3]);
                  auVar11 = vcvtph2ps_f16c(auVar7);
                  auVar12 = vfmadd213ps_fma(auVar28,auVar27,*pauVar20);
                  auVar7 = vlddqu_avx(pauVar23[4]);
                  auVar8 = vlddqu_avx(pauVar23[5]);
                  auVar9 = vlddqu_avx(pauVar23[6]);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar29,auVar60);
                  auVar12 = vlddqu_avx(pauVar23[7]);
                  uVar2 = puVar21[8];
                  auVar87._4_4_ = uVar2;
                  auVar87._0_4_ = uVar2;
                  auVar87._8_4_ = uVar2;
                  auVar87._12_4_ = uVar2;
                  auVar87._16_4_ = uVar2;
                  auVar87._20_4_ = uVar2;
                  auVar87._24_4_ = uVar2;
                  auVar87._28_4_ = uVar2;
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar32,auVar53);
                  auVar28 = vcvtph2ps_f16c(auVar7);
                  uVar2 = puVar21[9];
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                  auVar61._16_4_ = uVar2;
                  auVar61._20_4_ = uVar2;
                  auVar61._24_4_ = uVar2;
                  auVar61._28_4_ = uVar2;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar11,auVar50);
                  uVar2 = puVar21[10];
                  auVar46._4_4_ = uVar2;
                  auVar46._0_4_ = uVar2;
                  auVar46._8_4_ = uVar2;
                  auVar46._12_4_ = uVar2;
                  auVar46._16_4_ = uVar2;
                  auVar46._20_4_ = uVar2;
                  auVar46._24_4_ = uVar2;
                  auVar46._28_4_ = uVar2;
                  uVar2 = puVar21[0xb];
                  auVar98._4_4_ = uVar2;
                  auVar98._0_4_ = uVar2;
                  auVar98._8_4_ = uVar2;
                  auVar98._12_4_ = uVar2;
                  auVar98._16_4_ = uVar2;
                  auVar98._20_4_ = uVar2;
                  auVar98._24_4_ = uVar2;
                  auVar98._28_4_ = uVar2;
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar28,auVar91);
                  auVar7 = vfmadd213ps_fma(auVar27,auVar87,pauVar20[1]);
                  auVar27 = vcvtph2ps_f16c(auVar8);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar61,auVar29);
                  uVar2 = puVar21[0xc];
                  auVar68._4_4_ = uVar2;
                  auVar68._0_4_ = uVar2;
                  auVar68._8_4_ = uVar2;
                  auVar68._12_4_ = uVar2;
                  auVar68._16_4_ = uVar2;
                  auVar68._20_4_ = uVar2;
                  auVar68._24_4_ = uVar2;
                  auVar68._28_4_ = uVar2;
                  auVar29 = vcvtph2ps_f16c(auVar9);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar46,auVar32);
                  uVar2 = puVar21[0xd];
                  auVar75._4_4_ = uVar2;
                  auVar75._0_4_ = uVar2;
                  auVar75._8_4_ = uVar2;
                  auVar75._12_4_ = uVar2;
                  auVar75._16_4_ = uVar2;
                  auVar75._20_4_ = uVar2;
                  auVar75._24_4_ = uVar2;
                  auVar75._28_4_ = uVar2;
                  auVar32 = vcvtph2ps_f16c(auVar12);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar98,auVar11);
                  uVar2 = puVar21[0xe];
                  auVar56._4_4_ = uVar2;
                  auVar56._0_4_ = uVar2;
                  auVar56._8_4_ = uVar2;
                  auVar56._12_4_ = uVar2;
                  auVar56._16_4_ = uVar2;
                  auVar56._20_4_ = uVar2;
                  auVar56._24_4_ = uVar2;
                  auVar56._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar81);
                  uVar2 = puVar21[0xf];
                  auVar92._4_4_ = uVar2;
                  auVar92._0_4_ = uVar2;
                  auVar92._8_4_ = uVar2;
                  auVar92._12_4_ = uVar2;
                  auVar92._16_4_ = uVar2;
                  auVar92._20_4_ = uVar2;
                  auVar92._24_4_ = uVar2;
                  auVar92._28_4_ = uVar2;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar68,auVar28);
                  auVar11._4_4_ = uVar1;
                  auVar11._0_4_ = uVar1;
                  auVar11._8_4_ = uVar1;
                  auVar11._12_4_ = uVar1;
                  auVar11._16_4_ = uVar1;
                  auVar11._20_4_ = uVar1;
                  auVar11._24_4_ = uVar1;
                  auVar11._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar11);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar75,auVar27);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar56,auVar29);
                  auVar7 = vlddqu_avx(pauVar23[8]);
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar32,local_78);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[9]);
                  auVar8 = vlddqu_avx(pauVar23[10]);
                  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar92,auVar32);
                  auVar9 = vlddqu_avx(pauVar23[0xb]);
                  auVar12 = vlddqu_avx(pauVar23[0xc]);
                  auVar13 = vlddqu_avx(pauVar23[0xd]);
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar27,auVar87);
                  auVar14 = vlddqu_avx(pauVar23[0xe]);
                  auVar10 = vlddqu_avx(pauVar23[0xf]);
                  uVar1 = puVar21[0x10];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  auVar15 = vfmadd213ps_fma(auVar32,auVar27,ZEXT1632(auVar15));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  uVar1 = puVar21[0x11];
                  auVar99._4_4_ = uVar1;
                  auVar99._0_4_ = uVar1;
                  auVar99._8_4_ = uVar1;
                  auVar99._12_4_ = uVar1;
                  auVar99._16_4_ = uVar1;
                  auVar99._20_4_ = uVar1;
                  auVar99._24_4_ = uVar1;
                  auVar99._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar27,auVar61);
                  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,auVar99);
                  uVar1 = puVar21[0x12];
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  auVar27 = vcvtph2ps_f16c(auVar8);
                  uVar1 = puVar21[0x13];
                  auVar95._4_4_ = uVar1;
                  auVar95._0_4_ = uVar1;
                  auVar95._8_4_ = uVar1;
                  auVar95._12_4_ = uVar1;
                  auVar95._16_4_ = uVar1;
                  auVar95._20_4_ = uVar1;
                  auVar95._24_4_ = uVar1;
                  auVar95._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,auVar46);
                  uVar1 = puVar21[0x14];
                  auVar100._4_4_ = uVar1;
                  auVar100._0_4_ = uVar1;
                  auVar100._8_4_ = uVar1;
                  auVar100._12_4_ = uVar1;
                  auVar100._16_4_ = uVar1;
                  auVar100._20_4_ = uVar1;
                  auVar100._24_4_ = uVar1;
                  auVar100._28_4_ = uVar1;
                  auVar29 = vcvtph2ps_f16c(auVar9);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar29,auVar98);
                  uVar1 = puVar21[0x15];
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar102._16_4_ = uVar1;
                  auVar102._20_4_ = uVar1;
                  auVar102._24_4_ = uVar1;
                  auVar102._28_4_ = uVar1;
                  auVar32 = vcvtph2ps_f16c(auVar12);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar32,auVar68);
                  uVar1 = puVar21[0x16];
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar69._16_4_ = uVar1;
                  auVar69._20_4_ = uVar1;
                  auVar69._24_4_ = uVar1;
                  auVar69._28_4_ = uVar1;
                  auVar11 = vcvtph2ps_f16c(auVar13);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar11,auVar75);
                  uVar1 = puVar21[0x17];
                  auVar76._4_4_ = uVar1;
                  auVar76._0_4_ = uVar1;
                  auVar76._8_4_ = uVar1;
                  auVar76._12_4_ = uVar1;
                  auVar76._16_4_ = uVar1;
                  auVar76._20_4_ = uVar1;
                  auVar76._24_4_ = uVar1;
                  auVar76._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar14);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,auVar42);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar95);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar32,auVar100);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar28,auVar56);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar11,auVar102);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar28,auVar69);
                  uVar1 = *puVar26;
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar43._16_4_ = uVar1;
                  auVar43._20_4_ = uVar1;
                  auVar43._24_4_ = uVar1;
                  auVar43._28_4_ = uVar1;
                  uVar1 = puVar26[1];
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar82._16_4_ = uVar1;
                  auVar82._20_4_ = uVar1;
                  auVar82._24_4_ = uVar1;
                  auVar82._28_4_ = uVar1;
                  uVar1 = puVar26[2];
                  auVar103._4_4_ = uVar1;
                  auVar103._0_4_ = uVar1;
                  auVar103._8_4_ = uVar1;
                  auVar103._12_4_ = uVar1;
                  auVar103._16_4_ = uVar1;
                  auVar103._20_4_ = uVar1;
                  auVar103._24_4_ = uVar1;
                  auVar103._28_4_ = uVar1;
                  uVar1 = puVar26[3];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  uVar1 = puVar26[4];
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  auVar62._16_4_ = uVar1;
                  auVar62._20_4_ = uVar1;
                  auVar62._24_4_ = uVar1;
                  auVar62._28_4_ = uVar1;
                  uVar1 = puVar26[5];
                  auVar96._4_4_ = uVar1;
                  auVar96._0_4_ = uVar1;
                  auVar96._8_4_ = uVar1;
                  auVar96._12_4_ = uVar1;
                  auVar96._16_4_ = uVar1;
                  auVar96._20_4_ = uVar1;
                  auVar96._24_4_ = uVar1;
                  auVar96._28_4_ = uVar1;
                  uVar1 = puVar26[6];
                  auVar101._4_4_ = uVar1;
                  auVar101._0_4_ = uVar1;
                  auVar101._8_4_ = uVar1;
                  auVar101._12_4_ = uVar1;
                  auVar101._16_4_ = uVar1;
                  auVar101._20_4_ = uVar1;
                  auVar101._24_4_ = uVar1;
                  auVar101._28_4_ = uVar1;
                  uVar1 = puVar26[7];
                  auVar7 = vlddqu_avx(pauVar23[0x10]);
                  auVar27 = vcvtph2ps_f16c(auVar10);
                  auVar29 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x11]);
                  auVar32 = vcvtph2ps_f16c(auVar7);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar92);
                  auVar7 = vlddqu_avx(pauVar23[0x12]);
                  auVar11 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x13]);
                  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar76);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar43,auVar29,ZEXT1632(auVar9));
                  auVar7 = vlddqu_avx(pauVar23[0x14]);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar32,auVar82);
                  auVar28 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x15]);
                  auVar8 = vlddqu_avx(pauVar23[0x16]);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar11,auVar103);
                  auVar9 = vlddqu_avx(pauVar23[0x17]);
                  uVar2 = puVar26[8];
                  auVar77._4_4_ = uVar2;
                  auVar77._0_4_ = uVar2;
                  auVar77._8_4_ = uVar2;
                  auVar77._12_4_ = uVar2;
                  auVar77._16_4_ = uVar2;
                  auVar77._20_4_ = uVar2;
                  auVar77._24_4_ = uVar2;
                  auVar77._28_4_ = uVar2;
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar27,auVar70);
                  auVar33 = vcvtph2ps_f16c(auVar7);
                  uVar2 = puVar26[9];
                  auVar71._4_4_ = uVar2;
                  auVar71._0_4_ = uVar2;
                  auVar71._8_4_ = uVar2;
                  auVar71._12_4_ = uVar2;
                  auVar71._16_4_ = uVar2;
                  auVar71._20_4_ = uVar2;
                  auVar71._24_4_ = uVar2;
                  auVar71._28_4_ = uVar2;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar62);
                  uVar2 = puVar26[10];
                  auVar63._4_4_ = uVar2;
                  auVar63._0_4_ = uVar2;
                  auVar63._8_4_ = uVar2;
                  auVar63._12_4_ = uVar2;
                  auVar63._16_4_ = uVar2;
                  auVar63._20_4_ = uVar2;
                  auVar63._24_4_ = uVar2;
                  auVar63._28_4_ = uVar2;
                  uVar2 = puVar26[0xb];
                  auVar83._4_4_ = uVar2;
                  auVar83._0_4_ = uVar2;
                  auVar83._8_4_ = uVar2;
                  auVar83._12_4_ = uVar2;
                  auVar83._16_4_ = uVar2;
                  auVar83._20_4_ = uVar2;
                  auVar83._24_4_ = uVar2;
                  auVar83._28_4_ = uVar2;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar33,auVar96);
                  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar77,auVar29);
                  uVar2 = puVar26[0xc];
                  auVar57._4_4_ = uVar2;
                  auVar57._0_4_ = uVar2;
                  auVar57._8_4_ = uVar2;
                  auVar57._12_4_ = uVar2;
                  auVar57._16_4_ = uVar2;
                  auVar57._20_4_ = uVar2;
                  auVar57._24_4_ = uVar2;
                  auVar57._28_4_ = uVar2;
                  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar71,auVar32);
                  uVar2 = puVar26[0xd];
                  auVar54._4_4_ = uVar2;
                  auVar54._0_4_ = uVar2;
                  auVar54._8_4_ = uVar2;
                  auVar54._12_4_ = uVar2;
                  auVar54._16_4_ = uVar2;
                  auVar54._20_4_ = uVar2;
                  auVar54._24_4_ = uVar2;
                  auVar54._28_4_ = uVar2;
                  auVar29 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar63,auVar11);
                  uVar2 = puVar26[0xe];
                  auVar97._4_4_ = uVar2;
                  auVar97._0_4_ = uVar2;
                  auVar97._8_4_ = uVar2;
                  auVar97._12_4_ = uVar2;
                  auVar97._16_4_ = uVar2;
                  auVar97._20_4_ = uVar2;
                  auVar97._24_4_ = uVar2;
                  auVar97._28_4_ = uVar2;
                  auVar32 = vcvtph2ps_f16c(auVar9);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar83,auVar27);
                  uVar2 = puVar26[0xf];
                  auVar51._4_4_ = uVar2;
                  auVar51._0_4_ = uVar2;
                  auVar51._8_4_ = uVar2;
                  auVar51._12_4_ = uVar2;
                  auVar51._16_4_ = uVar2;
                  auVar51._20_4_ = uVar2;
                  auVar51._24_4_ = uVar2;
                  auVar51._28_4_ = uVar2;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar29,auVar101);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar57,auVar28);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar54,auVar33);
                  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar97,auVar29);
                  auVar27._4_4_ = uVar1;
                  auVar27._0_4_ = uVar1;
                  auVar27._8_4_ = uVar1;
                  auVar27._12_4_ = uVar1;
                  auVar27._16_4_ = uVar1;
                  auVar27._20_4_ = uVar1;
                  auVar27._24_4_ = uVar1;
                  auVar27._28_4_ = uVar1;
                  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar32,auVar27);
                  auVar7 = vlddqu_avx(pauVar23[0x18]);
                  auVar8 = vlddqu_avx(pauVar23[0x19]);
                  auVar9 = vlddqu_avx(pauVar23[0x1a]);
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar51,auVar32);
                  auVar12 = vlddqu_avx(pauVar23[0x1b]);
                  auVar13 = vlddqu_avx(pauVar23[0x1c]);
                  auVar14 = vlddqu_avx(pauVar23[0x1d]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x1e]);
                  auVar10 = vlddqu_avx(pauVar23[0x1f]);
                  uVar1 = puVar26[0x10];
                  auVar104._4_4_ = uVar1;
                  auVar104._0_4_ = uVar1;
                  auVar104._8_4_ = uVar1;
                  auVar104._12_4_ = uVar1;
                  auVar104._16_4_ = uVar1;
                  auVar104._20_4_ = uVar1;
                  auVar104._24_4_ = uVar1;
                  auVar104._28_4_ = uVar1;
                  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,auVar77);
                  auVar15 = vfmadd213ps_fma(auVar104,auVar27,ZEXT1632(auVar16));
                  auVar27 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar27,auVar71);
                  uVar1 = puVar26[0x11];
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,auVar33);
                  auVar27 = vcvtph2ps_f16c(auVar9);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar63);
                  uVar1 = puVar26[0x12];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar34._16_4_ = uVar1;
                  auVar34._20_4_ = uVar1;
                  auVar34._24_4_ = uVar1;
                  auVar34._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar27,auVar34);
                  auVar27 = vcvtph2ps_f16c(auVar12);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar83);
                  uVar1 = puVar26[0x13];
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  auVar35._16_4_ = uVar1;
                  auVar35._20_4_ = uVar1;
                  auVar35._24_4_ = uVar1;
                  auVar35._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar35);
                  uVar1 = puVar26[0x14];
                  auVar29._4_4_ = uVar1;
                  auVar29._0_4_ = uVar1;
                  auVar29._8_4_ = uVar1;
                  auVar29._12_4_ = uVar1;
                  auVar29._16_4_ = uVar1;
                  auVar29._20_4_ = uVar1;
                  auVar29._24_4_ = uVar1;
                  auVar29._28_4_ = uVar1;
                  auVar27 = vcvtph2ps_f16c(auVar13);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar57);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar29);
                  auVar27 = vcvtph2ps_f16c(auVar14);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar54);
                  uVar1 = puVar26[0x15];
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar36._16_4_ = uVar1;
                  auVar36._20_4_ = uVar1;
                  auVar36._24_4_ = uVar1;
                  auVar36._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar36);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar97);
                  uVar1 = puVar26[0x16];
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar37);
                  auVar27 = vcvtph2ps_f16c(auVar10);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,auVar51);
                  uVar1 = puVar26[0x17];
                  auVar38._4_4_ = uVar1;
                  auVar38._0_4_ = uVar1;
                  auVar38._8_4_ = uVar1;
                  auVar38._12_4_ = uVar1;
                  auVar38._16_4_ = uVar1;
                  auVar38._20_4_ = uVar1;
                  auVar38._24_4_ = uVar1;
                  auVar38._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar38);
                  *pauVar20 = ZEXT1632(auVar7);
                  pauVar20[1] = ZEXT1632(auVar8);
                  puVar21 = puVar21 + 0x10;
                  puVar26 = puVar26 + 0x10;
                  pauVar20 = pauVar20 + 2;
                  iVar25 = iVar25 + 2;
                  uVar19 = uVar4 & 0xfffffffe;
                } while (iVar25 < (int)uVar4);
              }
              iVar25 = uVar4 - uVar19;
              if (iVar25 != 0 && (int)uVar19 <= (int)uVar4) {
                do {
                  uVar1 = *puVar21;
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  auVar44._16_4_ = uVar1;
                  auVar44._20_4_ = uVar1;
                  auVar44._24_4_ = uVar1;
                  auVar44._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar47._16_4_ = uVar1;
                  auVar47._20_4_ = uVar1;
                  auVar47._24_4_ = uVar1;
                  auVar47._28_4_ = uVar1;
                  uVar1 = puVar21[2];
                  auVar52._4_4_ = uVar1;
                  auVar52._0_4_ = uVar1;
                  auVar52._8_4_ = uVar1;
                  auVar52._12_4_ = uVar1;
                  auVar52._16_4_ = uVar1;
                  auVar52._20_4_ = uVar1;
                  auVar52._24_4_ = uVar1;
                  auVar52._28_4_ = uVar1;
                  uVar1 = puVar21[3];
                  auVar55._4_4_ = uVar1;
                  auVar55._0_4_ = uVar1;
                  auVar55._8_4_ = uVar1;
                  auVar55._12_4_ = uVar1;
                  auVar55._16_4_ = uVar1;
                  auVar55._20_4_ = uVar1;
                  auVar55._24_4_ = uVar1;
                  auVar55._28_4_ = uVar1;
                  uVar1 = puVar21[4];
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  uVar1 = puVar21[5];
                  auVar64._4_4_ = uVar1;
                  auVar64._0_4_ = uVar1;
                  auVar64._8_4_ = uVar1;
                  auVar64._12_4_ = uVar1;
                  auVar64._16_4_ = uVar1;
                  auVar64._20_4_ = uVar1;
                  auVar64._24_4_ = uVar1;
                  auVar64._28_4_ = uVar1;
                  uVar1 = puVar21[6];
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar39._16_4_ = uVar1;
                  auVar39._20_4_ = uVar1;
                  auVar39._24_4_ = uVar1;
                  auVar39._28_4_ = uVar1;
                  uVar1 = puVar21[7];
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  auVar7 = vlddqu_avx(*pauVar23);
                  auVar8 = vlddqu_avx(pauVar23[1]);
                  auVar9 = vlddqu_avx(pauVar23[2]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[3]);
                  auVar12 = vfmadd213ps_fma(auVar27,auVar44,*pauVar20);
                  auVar27 = vcvtph2ps_f16c(auVar8);
                  auVar29 = vcvtph2ps_f16c(auVar9);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar47,auVar27);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar52,auVar29);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar55,auVar27);
                  auVar7 = vlddqu_avx(pauVar23[4]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar58,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[5]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[6]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar64,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[7]);
                  uVar1 = puVar21[8];
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  uVar1 = puVar21[9];
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  auVar65._16_4_ = uVar1;
                  auVar65._20_4_ = uVar1;
                  auVar65._24_4_ = uVar1;
                  auVar65._28_4_ = uVar1;
                  uVar1 = puVar21[10];
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar72._16_4_ = uVar1;
                  auVar72._20_4_ = uVar1;
                  auVar72._24_4_ = uVar1;
                  auVar72._28_4_ = uVar1;
                  uVar1 = puVar21[0xb];
                  auVar78._4_4_ = uVar1;
                  auVar78._0_4_ = uVar1;
                  auVar78._8_4_ = uVar1;
                  auVar78._12_4_ = uVar1;
                  auVar78._16_4_ = uVar1;
                  auVar78._20_4_ = uVar1;
                  auVar78._24_4_ = uVar1;
                  auVar78._28_4_ = uVar1;
                  uVar1 = puVar21[0xc];
                  auVar84._4_4_ = uVar1;
                  auVar84._0_4_ = uVar1;
                  auVar84._8_4_ = uVar1;
                  auVar84._12_4_ = uVar1;
                  auVar84._16_4_ = uVar1;
                  auVar84._20_4_ = uVar1;
                  auVar84._24_4_ = uVar1;
                  auVar84._28_4_ = uVar1;
                  uVar1 = puVar21[0xd];
                  auVar88._4_4_ = uVar1;
                  auVar88._0_4_ = uVar1;
                  auVar88._8_4_ = uVar1;
                  auVar88._12_4_ = uVar1;
                  auVar88._16_4_ = uVar1;
                  auVar88._20_4_ = uVar1;
                  auVar88._24_4_ = uVar1;
                  auVar88._28_4_ = uVar1;
                  uVar1 = puVar21[0xe];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  auVar8 = vfmadd213ps_fma(auVar27,auVar39,ZEXT1632(auVar8));
                  uVar1 = puVar21[0xf];
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar40._16_4_ = uVar1;
                  auVar40._20_4_ = uVar1;
                  auVar40._24_4_ = uVar1;
                  auVar40._28_4_ = uVar1;
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar30,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[8]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar59,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[9]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[10]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar65,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar72,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0xb]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar78,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0xc]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar84,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0xd]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0xe]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar88,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0xf]);
                  uVar1 = *puVar26;
                  auVar66._4_4_ = uVar1;
                  auVar66._0_4_ = uVar1;
                  auVar66._8_4_ = uVar1;
                  auVar66._12_4_ = uVar1;
                  auVar66._16_4_ = uVar1;
                  auVar66._20_4_ = uVar1;
                  auVar66._24_4_ = uVar1;
                  auVar66._28_4_ = uVar1;
                  uVar1 = puVar26[1];
                  auVar73._4_4_ = uVar1;
                  auVar73._0_4_ = uVar1;
                  auVar73._8_4_ = uVar1;
                  auVar73._12_4_ = uVar1;
                  auVar73._16_4_ = uVar1;
                  auVar73._20_4_ = uVar1;
                  auVar73._24_4_ = uVar1;
                  auVar73._28_4_ = uVar1;
                  uVar1 = puVar26[2];
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar79._16_4_ = uVar1;
                  auVar79._20_4_ = uVar1;
                  auVar79._24_4_ = uVar1;
                  auVar79._28_4_ = uVar1;
                  uVar1 = puVar26[3];
                  auVar85._4_4_ = uVar1;
                  auVar85._0_4_ = uVar1;
                  auVar85._8_4_ = uVar1;
                  auVar85._12_4_ = uVar1;
                  auVar85._16_4_ = uVar1;
                  auVar85._20_4_ = uVar1;
                  auVar85._24_4_ = uVar1;
                  auVar85._28_4_ = uVar1;
                  uVar1 = puVar26[4];
                  auVar89._4_4_ = uVar1;
                  auVar89._0_4_ = uVar1;
                  auVar89._8_4_ = uVar1;
                  auVar89._12_4_ = uVar1;
                  auVar89._16_4_ = uVar1;
                  auVar89._20_4_ = uVar1;
                  auVar89._24_4_ = uVar1;
                  auVar89._28_4_ = uVar1;
                  uVar1 = puVar26[5];
                  auVar93._4_4_ = uVar1;
                  auVar93._0_4_ = uVar1;
                  auVar93._8_4_ = uVar1;
                  auVar93._12_4_ = uVar1;
                  auVar93._16_4_ = uVar1;
                  auVar93._20_4_ = uVar1;
                  auVar93._24_4_ = uVar1;
                  auVar93._28_4_ = uVar1;
                  uVar1 = puVar26[6];
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  auVar8 = vfmadd213ps_fma(auVar27,auVar48,ZEXT1632(auVar8));
                  uVar1 = puVar26[7];
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar31._16_4_ = uVar1;
                  auVar31._20_4_ = uVar1;
                  auVar31._24_4_ = uVar1;
                  auVar31._28_4_ = uVar1;
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar40,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x10]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar66,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x11]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x12]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar73,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar79,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x13]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar85,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x14]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar89,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x15]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x16]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar93,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x17]);
                  uVar1 = puVar26[8];
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar67._16_4_ = uVar1;
                  auVar67._20_4_ = uVar1;
                  auVar67._24_4_ = uVar1;
                  auVar67._28_4_ = uVar1;
                  uVar1 = puVar26[9];
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar74._16_4_ = uVar1;
                  auVar74._20_4_ = uVar1;
                  auVar74._24_4_ = uVar1;
                  auVar74._28_4_ = uVar1;
                  uVar1 = puVar26[10];
                  auVar80._4_4_ = uVar1;
                  auVar80._0_4_ = uVar1;
                  auVar80._8_4_ = uVar1;
                  auVar80._12_4_ = uVar1;
                  auVar80._16_4_ = uVar1;
                  auVar80._20_4_ = uVar1;
                  auVar80._24_4_ = uVar1;
                  auVar80._28_4_ = uVar1;
                  uVar1 = puVar26[0xb];
                  auVar86._4_4_ = uVar1;
                  auVar86._0_4_ = uVar1;
                  auVar86._8_4_ = uVar1;
                  auVar86._12_4_ = uVar1;
                  auVar86._16_4_ = uVar1;
                  auVar86._20_4_ = uVar1;
                  auVar86._24_4_ = uVar1;
                  auVar86._28_4_ = uVar1;
                  uVar1 = puVar26[0xc];
                  auVar90._4_4_ = uVar1;
                  auVar90._0_4_ = uVar1;
                  auVar90._8_4_ = uVar1;
                  auVar90._12_4_ = uVar1;
                  auVar90._16_4_ = uVar1;
                  auVar90._20_4_ = uVar1;
                  auVar90._24_4_ = uVar1;
                  auVar90._28_4_ = uVar1;
                  uVar1 = puVar26[0xd];
                  auVar94._4_4_ = uVar1;
                  auVar94._0_4_ = uVar1;
                  auVar94._8_4_ = uVar1;
                  auVar94._12_4_ = uVar1;
                  auVar94._16_4_ = uVar1;
                  auVar94._20_4_ = uVar1;
                  auVar94._24_4_ = uVar1;
                  auVar94._28_4_ = uVar1;
                  uVar1 = puVar26[0xe];
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  auVar8 = vfmadd213ps_fma(auVar27,auVar45,ZEXT1632(auVar8));
                  uVar1 = puVar26[0xf];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar41._16_4_ = uVar1;
                  auVar41._20_4_ = uVar1;
                  auVar41._24_4_ = uVar1;
                  auVar41._28_4_ = uVar1;
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar31,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x18]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar67,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x19]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vlddqu_avx(pauVar23[0x1a]);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar74,ZEXT1632(auVar8));
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar80,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x1b]);
                  puVar21 = puVar21 + 8;
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar86,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x1c]);
                  puVar26 = puVar26 + 8;
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar90,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x1d]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar94,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x1e]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar8 = vfmadd213ps_fma(auVar27,auVar49,ZEXT1632(auVar8));
                  auVar7 = vlddqu_avx(pauVar23[0x1f]);
                  auVar27 = vcvtph2ps_f16c(auVar7);
                  auVar7 = vfmadd213ps_fma(auVar27,auVar41,ZEXT1632(auVar8));
                  *pauVar20 = ZEXT1632(auVar7);
                  pauVar20 = pauVar20 + 1;
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              puVar21 = puVar21 + 8;
              puVar26 = puVar26 + 8;
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar5);
          }
          local_208 = local_208 + 1;
        } while (local_208 != uVar6);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar3);
  }
  return;
}

Assistant:

static void conv2x2s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const unsigned short* kptr = (const unsigned short*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}